

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O1

void phyr::stratifiedSample2D(Point2f *sample,int nxSamples,int nySamples,bool jitter,RNG *rng)

{
  long lVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [16];
  byte bVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  Point2f PVar16;
  
  auVar4 = _DAT_0010d3c0;
  if (0 < nySamples) {
    auVar12._0_8_ = (double)nxSamples;
    auVar12._8_8_ = (double)nySamples;
    auVar12 = divpd(_DAT_0010d060,auVar12);
    iVar7 = 0;
    dVar13 = 0.0;
    uVar9 = *(ulong *)rng;
    do {
      uVar10 = uVar9;
      if (0 < nxSamples) {
        lVar1 = *(long *)(rng + 8);
        dVar14 = 0.0;
        iVar6 = nxSamples;
        do {
          if (jitter) {
            uVar8 = uVar9 * 0x5851f42d4c957f2d + lVar1;
            uVar11 = (uint)(uVar9 >> 0x2d) ^ (uint)(uVar9 >> 0x1b);
            bVar5 = (byte)(uVar9 >> 0x3b);
            *(ulong *)rng = uVar8;
            dVar15 = (double)((float)(uVar11 >> bVar5 | uVar11 << 0x20 - bVar5) * 2.3283064e-10);
            uVar10 = uVar8;
            if (0.9999999999999999 <= dVar15) {
              dVar15 = 0.9999999999999999;
            }
          }
          else {
            dVar15 = 0.5;
            uVar8 = uVar9;
          }
          if (jitter) {
            uVar9 = uVar8 * 0x5851f42d4c957f2d + lVar1;
            uVar11 = (uint)(uVar8 >> 0x2d) ^ (uint)(uVar8 >> 0x1b);
            bVar5 = (byte)(uVar8 >> 0x3b);
            *(ulong *)rng = uVar9;
            dVar3 = (double)((float)(uVar11 >> bVar5 | uVar11 << 0x20 - bVar5) * 2.3283064e-10);
            uVar10 = uVar9;
            if (0.9999999999999999 <= dVar3) {
              dVar3 = 0.9999999999999999;
            }
          }
          else {
            dVar3 = 0.5;
            uVar9 = uVar8;
          }
          dVar3 = (dVar13 + dVar3) * auVar12._8_8_;
          auVar2._8_4_ = SUB84(dVar3,0);
          auVar2._0_8_ = (dVar14 + dVar15) * auVar12._0_8_;
          auVar2._12_4_ = (int)((ulong)dVar3 >> 0x20);
          PVar16 = (Point2f)minpd(auVar4,auVar2);
          *sample = PVar16;
          sample = sample + 1;
          dVar14 = dVar14 + 1.0;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      dVar13 = dVar13 + 1.0;
      iVar7 = iVar7 + 1;
      uVar9 = uVar10;
    } while (iVar7 != nySamples);
  }
  return;
}

Assistant:

void stratifiedSample2D(Point2f* sample, int nxSamples, int nySamples, bool jitter, RNG& rng) {
    Real invXSamples = Real(1) / nxSamples, invYSamples = Real(1) / nySamples;
    for (int y = 0; y < nySamples; y++) {
        for (int x = 0; x < nxSamples; x++) {
            Real offX = jitter ? rng.uniformReal() : 0.5;
            Real offY = jitter ? rng.uniformReal() : 0.5;
            sample->x = std::min((x + offX) * invXSamples, OneMinusEpsilon);
            sample->y = std::min((y + offY) * invYSamples, OneMinusEpsilon);
            ++sample;
        }
    }
}